

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ExceptionOr<capnp::Capability::Client>::~ExceptionOr
          (ExceptionOr<capnp::Capability::Client> *this)

{
  ExceptionOr<capnp::Capability::Client> *this_local;
  
  Maybe<capnp::Capability::Client>::~Maybe(&this->value);
  ExceptionOrValue::~ExceptionOrValue(&this->super_ExceptionOrValue);
  return;
}

Assistant:

ExceptionOr() = default;